

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5319c9::TestCallback::toApp
          (TestCallback *this,Message *message,SessionID *param_2)

{
  FieldMap *this_00;
  bool bVar1;
  int iVar2;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  _Var3;
  DoNotSend *this_01;
  MsgType msgType;
  PossDupFlag possDupFlag;
  undefined1 local_d8 [88];
  FieldBase local_80;
  
  if (this->checkForDoNotSend != 0) {
    FIX::StringField::StringField((StringField *)&local_80,0x3a);
    local_80._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003293c8;
    bVar1 = FIX::FieldMap::getFieldIfSet((FieldMap *)message,&local_80);
    if (bVar1) {
      iVar2 = std::__cxx11::string::compare((char *)&local_80.m_string);
      if (iVar2 == 0) {
        this_01 = (DoNotSend *)__cxa_allocate_exception(0x50);
        local_d8._0_8_ = local_d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
        FIX::DoNotSend::DoNotSend(this_01,(string *)local_d8);
        __cxa_throw(this_01,&FIX::DoNotSend::typeinfo,FIX::Exception::~Exception);
      }
    }
    FIX::FieldBase::~FieldBase(&local_80);
  }
  FIX::BoolField::BoolField((BoolField *)&local_80,0x2b,false);
  local_80._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0032dc10;
  this_00 = (FieldMap *)(message + 0x70);
  _Var3 = FIX::FieldMap::
          lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                    (this_00,*(FieldBase **)(message + 0x78),*(FieldBase **)(message + 0x80),
                     local_80.m_tag);
  if (_Var3._M_current != *(FieldBase **)(message + 0x80)) {
    FIX::FieldMap::getField(this_00,&local_80);
  }
  bVar1 = FIX::BoolField::getValue((BoolField *)&local_80);
  if (bVar1) {
    this->resent = this->resent + 1;
    FIX::Message::operator=(&this->lastResent,message);
  }
  FIX::StringField::StringField((StringField *)local_d8,0x23);
  local_d8._0_8_ = &PTR__FieldBase_003284a8;
  FIX::FieldMap::getField(this_00,(FieldBase *)local_d8);
  if (*(char *)local_d8._16_8_ == 'j') {
    this->toBusinessMessageReject = this->toBusinessMessageReject + 1;
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_d8);
  FIX::FieldBase::~FieldBase(&local_80);
  return;
}

Assistant:

EXCEPT(DoNotSend) {
    if (checkForDoNotSend) {
      FIX::Text text;
      if (message.getFieldIfSet(text) && text == "DoNotSend") {
        throw DoNotSend();
      }
    }

    PossDupFlag possDupFlag(false);
    if (message.getHeader().isSetField(possDupFlag)) {
      message.getHeader().getField(possDupFlag);
    }
    if (possDupFlag) {
      resent++;
      lastResent = message;
    }

    MsgType msgType;
    message.getHeader().getField(msgType);
    switch (msgType.getValue()[0]) {
    case 'j':
      toBusinessMessageReject++;
      break;
    }
  }